

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit
          (CodeGenerateVisitor *this,LocalNameListStatement *l_namelist_stmt,void *data)

{
  bool bVar1;
  pointer pSVar2;
  long in_RSI;
  CodeGenerateVisitor *in_RDI;
  NameListData_conflict name_list_data;
  CodeGenerateException *anon_var_0;
  ExpListData_conflict exp_list_data;
  Guard g;
  int end_register;
  int start_register;
  Guard *in_stack_ffffffffffffff00;
  anon_class_16_2_2474c042 *in_stack_ffffffffffffff08;
  function<void_()> *in_stack_ffffffffffffff10;
  function<void_()> *in_stack_ffffffffffffff18;
  Guard *this_00;
  NameListData local_c1;
  ExpListData local_b4 [7];
  int local_98;
  int local_68;
  Guard local_60 [2];
  int local_20;
  int local_1c;
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a195d);
  if (bVar1) {
    local_1c = GetNextRegisterId(in_RDI);
    local_68 = local_1c + *(int *)(local_10 + 0x20);
    this_00 = local_60;
    local_20 = local_68;
    std::function<void()>::
    function<luna::CodeGenerateVisitor::Visit(luna::LocalNameListStatement*,void*)::__0,void>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_98 = local_1c;
    std::function<void()>::
    function<luna::CodeGenerateVisitor::Visit(luna::LocalNameListStatement*,void*)::__1,void>
              (in_stack_ffffffffffffff10,(anon_class_16_2_33d932db *)in_stack_ffffffffffffff08);
    Guard::Guard(this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::function<void_()>::~function((function<void_()> *)0x1a1a15);
    std::function<void_()>::~function((function<void_()> *)0x1a1a22);
    ExpListData::ExpListData(local_b4,local_1c,local_20);
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x1a1a4d);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_b4);
    Guard::~Guard(in_stack_ffffffffffffff00);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a1ba4);
  NameListData::NameListData(&local_c1,(bool)((bVar1 ^ 0xffU) & 1));
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1a1bc7);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,&local_c1);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(LocalNameListStatement *l_namelist_stmt, void *data)
    {
        // Generate code for expression list first, then expression list can get
        // variables which has the same name with variables defined in NameList
        // e.g.
        //     local i = 1
        //     local i = i -- i value is 1
        if (l_namelist_stmt->exp_list_)
        {
            // Reserve registers for NameList
            int start_register = GetNextRegisterId();
            int end_register = start_register + l_namelist_stmt->name_count_;
            Guard g([=]() { this->ResetRegisterIdGenerator(end_register); },
                    [=]() { this->ResetRegisterIdGenerator(start_register); });

            try
            {
                ExpListData exp_list_data{ start_register, end_register };
                l_namelist_stmt->exp_list_->Accept(this, &exp_list_data);
            }
            catch (const CodeGenerateException &)
            {
                throw CodeGenerateException(
                    GetCurrentFunction()->GetModule()->GetCStr(),
                    l_namelist_stmt->line_,
                    "expression of local name list is too complex");
            }
        }

        // NameList need init itself when ExpList is not existed
        NameListData name_list_data{ !l_namelist_stmt->exp_list_ };
        l_namelist_stmt->name_list_->Accept(this, &name_list_data);
    }